

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_label_impl.h
# Opt level: O3

void __thiscall label::JSONLabel::JSONLabel(JSONLabel *this,string *label)

{
  int iVar1;
  uint uVar2;
  
  (this->label_)._M_dataplus._M_p = (pointer)&(this->label_).field_2;
  (this->label_)._M_string_length = 0;
  (this->label_).field_2._M_local_buf[0] = '\0';
  this->type_ = 0;
  std::__cxx11::string::_M_assign((string *)this);
  iVar1 = std::__cxx11::string::compare((char *)label);
  if (iVar1 == 0) {
    uVar2 = 0;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)label);
    if (iVar1 == 0) {
      uVar2 = 1;
    }
    else if ((label->_M_string_length < 2) ||
            (uVar2 = 2, (label->_M_dataplus)._M_p[label->_M_string_length - 1] != ':')) {
      uVar2 = 3;
    }
  }
  this->type_ = uVar2;
  return;
}

Assistant:

JSONLabel::JSONLabel(const std::string& label) {
  label_ = label;

  // Set type to 0 in case of an object. An object is indicated by opening
  // and closing curly braces.
  if (label.compare("\\{\\}") == 0) {
    type_ = 0;
  }
  // Set type to 1 in case of an array. An array is indicated by opening
  // and closing brackets.
  else if (label.compare("[]") == 0) {
    type_ = 1;
  }
  // Set type to 2 in case of an key. A key is indicated by a colon after
  // the key itself.
  else if (label.length() >= 2 && label[label.length() - 1] == ':') {
    type_ = 2;
  }
  // Otherwise, set type to 3 in case of a value.
  else {
    type_ = 3;
  }
}